

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O1

result * __thiscall
lest::expression_lhs<std::set<int,std::less<int>,std::allocator<int>>const&>::operator==
          (result *__return_storage_ptr__,
          expression_lhs<std::set<int,std::less<int>,std::allocator<int>>const&> *this,
          set<int,_std::less<int>,_std::allocator<int>_> *rhs)

{
  undefined1 *puVar1;
  long lVar2;
  lest *this_00;
  size_t sVar3;
  bool bVar4;
  set<int,_std::less<int>,_std::allocator<int>_> *in_R8;
  _Base_ptr *local_d8;
  undefined1 local_d0 [32];
  size_t local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  _Base_ptr *local_98;
  _Rb_tree_node_base local_90;
  size_t local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  bool local_58;
  undefined1 *local_50;
  long local_48;
  undefined1 local_40 [16];
  
  lVar2 = *(long *)this;
  if (*(size_t *)(lVar2 + 0x28) == (rhs->_M_t)._M_impl.super__Rb_tree_header._M_node_count) {
    bVar4 = std::__equal<false>::
            equal<std::_Rb_tree_const_iterator<int>,std::_Rb_tree_const_iterator<int>>
                      (*(_Base_ptr *)(lVar2 + 0x18),(_Base_ptr)(lVar2 + 8),
                       (rhs->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left);
  }
  else {
    bVar4 = false;
  }
  this_00 = *(lest **)this;
  puVar1 = local_d0 + 8;
  local_d8 = (_Base_ptr *)puVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"==","");
  local_98 = &local_90._M_parent;
  if (local_d8 == (_Base_ptr *)puVar1) {
    local_90._M_left = (_Base_ptr)local_d0._16_8_;
  }
  else {
    local_98 = local_d8;
  }
  local_90._0_8_ = local_d0._0_8_;
  local_d0._0_8_ = 0;
  local_d0[8] = 0;
  local_d8 = (_Base_ptr *)puVar1;
  to_string<std::set<int,std::less<int>,std::allocator<int>>,std::set<int,std::less<int>,std::allocator<int>>>
            ((string *)(local_d0 + 0x18),this_00,
             (set<int,_std::less<int>,_std::allocator<int>_> *)&local_98,(string *)rhs,in_R8);
  sVar3 = local_b0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._24_8_ == &local_a8) {
    local_68._8_4_ = local_a8._8_4_;
    local_68._12_4_ = local_a8._12_4_;
    local_90._M_right = (_Base_ptr)&local_68;
  }
  else {
    local_90._M_right = (_Base_ptr)local_d0._24_8_;
  }
  local_70 = local_b0;
  local_b0 = 0;
  local_a8._M_allocated_capacity._0_4_ = local_a8._M_allocated_capacity._0_4_ & 0xffffff00;
  local_d0._24_8_ = &local_a8;
  local_58 = bVar4;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,local_90._M_right,(long)local_90._M_right + sVar3);
  __return_storage_ptr__->passed = local_58;
  (__return_storage_ptr__->decomposition)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->decomposition).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->decomposition,local_50,local_50 + local_48);
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_right != &local_68) {
    operator_delete(local_90._M_right);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._24_8_ != &local_a8) {
    operator_delete((void *)local_d0._24_8_);
  }
  if (local_98 != &local_90._M_parent) {
    operator_delete(local_98);
  }
  if (local_d8 != (_Base_ptr *)puVar1) {
    operator_delete(local_d8);
  }
  return __return_storage_ptr__;
}

Assistant:

result operator< ( R const & rhs ) { return result{ lhs <  rhs, to_string( lhs, "<" , rhs ) }; }